

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

void __thiscall
argparse::ArgumentParser::parse_args_internal
          (ArgumentParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aArguments)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  char *pcVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  _Rb_tree_header *p_Var4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  start;
  const_iterator cVar5;
  runtime_error *prVar6;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  start_00;
  _Self __tmp;
  _List_node_base *p_Var7;
  Argument *this_00;
  ulong uVar8;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  *__const_this;
  string_view s;
  string tHypotheticalArgument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _List_node_base *local_38;
  
  __str = (aArguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (((this->mProgramName)._M_string_length == 0) &&
     (__str != (aArguments->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->mProgramName,__str);
    __str = (aArguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
    in_RDX = extraout_RDX;
  }
  end._M_current =
       (aArguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  start_00._M_current = __str + 1;
  if (start_00._M_current != end._M_current) {
    p_Var7 = (this->mPositionalArguments).
             super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    local_38 = (_List_node_base *)&this->mPositionalArguments;
    p_Var4 = &(this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header;
    do {
      if (((((start_00._M_current)->_M_string_length == 0) ||
           (pcVar1 = ((start_00._M_current)->_M_dataplus)._M_p, *pcVar1 != '-')) ||
          (this_00 = (Argument *)((start_00._M_current)->_M_string_length - 1),
          this_00 == (Argument *)0x0)) ||
         (s._M_len = pcVar1 + 1, s._M_str = in_RDX, bVar3 = Argument::is_decimal_literal(this_00,s),
         bVar3)) {
        if (p_Var7 == local_38) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar6,"Maximum number of positional arguments exceeded");
LAB_0013e839:
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        p_Var2 = p_Var7->_M_next;
        start = Argument::
                consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((Argument *)(p_Var7 + 1),start_00,end,(string_view)ZEXT816(0));
        in_RDX = extraout_RDX_00;
        p_Var7 = p_Var2;
      }
      else {
        cVar5 = std::
                _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                ::_M_find_tr<std::__cxx11::string,void>
                          ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                            *)&this->mArgumentMap,start_00._M_current);
        if ((_Rb_tree_header *)cVar5._M_node == p_Var4) {
          if ((((start_00._M_current)->_M_string_length < 2) ||
              (pcVar1 = ((start_00._M_current)->_M_dataplus)._M_p, *pcVar1 != '-')) ||
             (pcVar1[1] == '-')) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Unknown argument");
            goto LAB_0013e839;
          }
          start._M_current = start_00._M_current + 1;
          uVar8 = 1;
          do {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            local_58.field_2._M_allocated_capacity._0_2_ =
                 (ushort)(byte)((start_00._M_current)->_M_dataplus)._M_p[uVar8] << 8 | 0x2d;
            local_58._M_string_length = 2;
            local_58.field_2._M_local_buf[2] = '\0';
            cVar5 = std::
                    _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                    ::_M_find_tr<std::__cxx11::string,void>
                              ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                                *)&this->mArgumentMap,&local_58);
            if ((_Rb_tree_header *)cVar5._M_node == p_Var4) {
              prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar6,"Unknown argument");
              __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            start = Argument::
                    consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((Argument *)&(cVar5._M_node[1]._M_left)->_M_left,start,end,
                               *(string_view *)(cVar5._M_node + 1));
            in_RDX = extraout_RDX_02;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,
                              CONCAT53(local_58.field_2._M_allocated_capacity._3_5_,
                                       CONCAT12(local_58.field_2._M_local_buf[2],
                                                local_58.field_2._M_allocated_capacity._0_2_)) + 1);
              in_RDX = extraout_RDX_03;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < (start_00._M_current)->_M_string_length);
        }
        else {
          start = Argument::
                  consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((Argument *)&(cVar5._M_node[1]._M_left)->_M_left,
                             start_00._M_current + 1,end,*(string_view *)(cVar5._M_node + 1));
          in_RDX = extraout_RDX_01;
        }
      }
      start_00._M_current = start._M_current;
    } while (start_00._M_current != end._M_current);
  }
  this->mIsParsed = true;
  return;
}

Assistant:

void parse_args_internal(const std::vector<std::string> &aArguments) {
            if (mProgramName.empty() && !aArguments.empty()) {
                mProgramName = aArguments.front();
            }
            auto end = std::end(aArguments);
            auto positionalArgumentIt = std::begin(mPositionalArguments);
            for (auto it = std::next(std::begin(aArguments)); it != end;) {
                const auto &tCurrentArgument = *it;
                if (Argument::is_positional(tCurrentArgument)) {
                    if (positionalArgumentIt == std::end(mPositionalArguments)) {
                        throw std::runtime_error(
                                "Maximum number of positional arguments exceeded");
                    }
                    auto tArgument = positionalArgumentIt++;
                    it = tArgument->consume(it, end);
                    continue;
                }

                auto tIterator = mArgumentMap.find(tCurrentArgument);
                if (tIterator != mArgumentMap.end()) {
                    auto tArgument = tIterator->second;
                    it = tArgument->consume(std::next(it), end, tIterator->first);
                } else if (const auto &tCompoundArgument = tCurrentArgument;
                        tCompoundArgument.size() > 1 && tCompoundArgument[0] == '-' &&
                        tCompoundArgument[1] != '-') {
                    ++it;
                    for (std::size_t j = 1; j < tCompoundArgument.size(); j++) {
                        auto tHypotheticalArgument = std::string{'-', tCompoundArgument[j]};
                        auto tIterator2 = mArgumentMap.find(tHypotheticalArgument);
                        if (tIterator2 != mArgumentMap.end()) {
                            auto tArgument = tIterator2->second;
                            it = tArgument->consume(it, end, tIterator2->first);
                        } else {
                            throw std::runtime_error("Unknown argument");
                        }
                    }
                } else {
                    throw std::runtime_error("Unknown argument");
                }
            }
            mIsParsed = true;
        }